

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O0

gnode_t * parse_function_declaration
                    (gravity_parser_t *parser,gtoken_t access_specifier,gtoken_t storage_specifier)

{
  gnode_t *pgVar1;
  gnode_function_decl_t *func;
  gnode_t *node;
  gtoken_t storage_specifier_local;
  gtoken_t access_specifier_local;
  gravity_parser_t *parser_local;
  
  parser_local = (gravity_parser_t *)parse_function(parser,true,access_specifier,storage_specifier);
  pgVar1 = get_enclosing(parser,NODE_FUNCTION_DECL);
  if (pgVar1 != (gnode_t *)0x0) {
    *(undefined1 *)((long)&parser_local[1].delegate + 5) = 1;
    parser_local = (gravity_parser_t *)
                   local_store_declaration
                             (parser,(char *)parser_local[1].lexer,(char *)0x0,access_specifier,
                              storage_specifier,(gnode_t *)parser_local);
  }
  return (gnode_t *)parser_local;
}

Assistant:

static gnode_t *parse_function_declaration (gravity_parser_t *parser, gtoken_t access_specifier, gtoken_t storage_specifier) {
    // convert a function declaration within another function to a local variable assignment
    // for example:
    //
    // func foo() {
    //    func bar() {...}
    // }
    //
    // is converter to:
    //
    // func foo() {
    //    var bar = func() {...}
    // }
    //
    // conversion is performed inside the parser
    // so next semantic checks can perform
    // identifier uniqueness checks
    gnode_t *node = parse_function(parser, true, access_specifier, storage_specifier);

    if (IS_FUNCTION_ENCLOSED()) {
        gnode_function_decl_t *func = (gnode_function_decl_t *)node;
        func->is_closure = true;
        return local_store_declaration(parser, func->identifier, NULL, access_specifier, storage_specifier, node);
    }
    return node;
}